

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void __thiscall
QPDF::JSONReactor::JSONReactor
          (JSONReactor *this,QPDF *pdf,shared_ptr<InputSource> *is,bool must_be_complete)

{
  allocator<char> local_79;
  undefined1 local_78 [16];
  string local_68;
  JSON_Descr local_48;
  
  (this->super_Reactor)._vptr_Reactor = (_func_int **)&PTR__JSONReactor_002b0a50;
  this->pdf = pdf;
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>,
             &is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
  this->must_be_complete = must_be_complete;
  (*((is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_InputSource[3]
  )();
  std::make_shared<std::__cxx11::string,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_78 + 0x10),"",&local_79);
  QPDFObject::JSON_Descr::JSON_Descr
            (&local_48,
             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78,(string *)(local_78 + 0x10));
  std::
  make_shared<std::variant<std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>,QPDFObject::JSON_Descr>
            ((JSON_Descr *)&this->descr);
  QPDFObject::JSON_Descr::~JSON_Descr(&local_48);
  std::__cxx11::string::~string((string *)(local_78 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  this->saw_objects = false;
  this->saw_json_version = false;
  this->saw_pdf_version = false;
  this->saw_trailer = false;
  this->errors = false;
  this->saw_qpdf = false;
  this->saw_qpdf_meta = false;
  this->saw_objects = false;
  (this->cur_object)._M_dataplus._M_p = (pointer)&(this->cur_object).field_2;
  (this->cur_object)._M_string_length = 0;
  (this->cur_object).field_2._M_local_buf[0] = '\0';
  this->saw_value = false;
  this->saw_stream = false;
  this->saw_dict = false;
  this->saw_data = false;
  this->saw_datafile = false;
  this->this_stream_needs_data = false;
  (this->stack).
  super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).
  super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack).
  super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->next_obj).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  *(undefined8 *)
   ((long)&(this->next_obj).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = 0;
  *(undefined8 *)
   ((long)&(this->next_obj).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4) = 0;
  return;
}

Assistant:

JSONReactor(QPDF& pdf, std::shared_ptr<InputSource> is, bool must_be_complete) :
        pdf(pdf),
        is(is),
        must_be_complete(must_be_complete),
        descr(
            std::make_shared<QPDFObject::Description>(
                QPDFObject::JSON_Descr(std::make_shared<std::string>(is->getName()), "")))
    {
    }